

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGImpactBvh.cpp
# Opt level: O3

int __thiscall
btBvhTree::_calc_splitting_axis
          (btBvhTree *this,GIM_BVH_DATA_ARRAY *primitive_boxes,int startIndex,int endIndex)

{
  uint uVar1;
  btScalar *pbVar2;
  int i;
  long lVar3;
  int iVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  iVar4 = endIndex - startIndex;
  if (iVar4 != 0 && startIndex <= endIndex) {
    lVar3 = (long)startIndex;
    pbVar2 = (primitive_boxes->super_btAlignedObjectArray<GIM_BVH_DATA>).m_data[lVar3].m_bound.m_max
             .m_floats + 1;
    lVar5 = endIndex - lVar3;
    fVar7 = 0.0;
    fVar9 = 0.0;
    fVar6 = 0.0;
    do {
      fVar6 = fVar6 + (((btVector3 *)(pbVar2 + -1))->m_floats[0] + pbVar2[-5]) * 0.5;
      fVar7 = fVar7 + ((float)*(undefined8 *)(pbVar2 + -4) + (float)*(undefined8 *)pbVar2) * 0.5;
      fVar9 = fVar9 + ((float)((ulong)*(undefined8 *)(pbVar2 + -4) >> 0x20) +
                      (float)((ulong)*(undefined8 *)pbVar2 >> 0x20)) * 0.5;
      pbVar2 = pbVar2 + 9;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    if (startIndex < endIndex) {
      fVar12 = 1.0 / (float)iVar4;
      pbVar2 = (primitive_boxes->super_btAlignedObjectArray<GIM_BVH_DATA>).m_data[lVar3].m_bound.
               m_max.m_floats + 1;
      lVar3 = endIndex - lVar3;
      fVar8 = 0.0;
      fVar10 = 0.0;
      fVar11 = 0.0;
      do {
        fVar13 = (((btVector3 *)(pbVar2 + -1))->m_floats[0] + pbVar2[-5]) * 0.5 - fVar6 * fVar12;
        fVar11 = fVar11 + fVar13 * fVar13;
        fVar13 = ((float)*(undefined8 *)(pbVar2 + -4) + (float)*(undefined8 *)pbVar2) * 0.5 -
                 fVar12 * fVar7;
        fVar14 = ((float)((ulong)*(undefined8 *)(pbVar2 + -4) >> 0x20) +
                 (float)((ulong)*(undefined8 *)pbVar2 >> 0x20)) * 0.5 - fVar12 * fVar9;
        fVar8 = fVar8 + fVar13 * fVar13;
        fVar10 = fVar10 + fVar14 * fVar14;
        pbVar2 = pbVar2 + 9;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
      goto LAB_0016e06c;
    }
  }
  fVar8 = 0.0;
  fVar10 = 0.0;
  fVar11 = 0.0;
LAB_0016e06c:
  fVar7 = 1.0 / ((float)iVar4 + -1.0);
  fVar11 = fVar11 * fVar7;
  fVar8 = fVar7 * fVar8;
  fVar6 = fVar8;
  if (fVar8 <= fVar11) {
    fVar6 = fVar11;
  }
  uVar1 = 2;
  if (fVar10 * fVar7 <= fVar6) {
    uVar1 = (uint)(fVar11 < fVar8);
  }
  return uVar1;
}

Assistant:

int btBvhTree::_calc_splitting_axis(
	GIM_BVH_DATA_ARRAY & primitive_boxes, int startIndex,  int endIndex)
{

	int i;

	btVector3 means(btScalar(0.),btScalar(0.),btScalar(0.));
	btVector3 variance(btScalar(0.),btScalar(0.),btScalar(0.));
	int numIndices = endIndex-startIndex;

	for (i=startIndex;i<endIndex;i++)
	{
		btVector3 center = btScalar(0.5)*(primitive_boxes[i].m_bound.m_max +
					 primitive_boxes[i].m_bound.m_min);
		means+=center;
	}
	means *= (btScalar(1.)/(btScalar)numIndices);

	for (i=startIndex;i<endIndex;i++)
	{
		btVector3 center = btScalar(0.5)*(primitive_boxes[i].m_bound.m_max +
					 primitive_boxes[i].m_bound.m_min);
		btVector3 diff2 = center-means;
		diff2 = diff2 * diff2;
		variance += diff2;
	}
	variance *= (btScalar(1.)/	((btScalar)numIndices-1)	);

	return variance.maxAxis();
}